

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O0

void __thiscall Imf_3_2::DwaCompressor::~DwaCompressor(DwaCompressor *this)

{
  Compressor *in_RDI;
  int i;
  Header *this_00;
  Header *this_01;
  int local_c;
  
  in_RDI->_vptr_Compressor = (_func_int **)&PTR__DwaCompressor_004c0640;
  if (in_RDI[10]._header != (Header *)0x0) {
    operator_delete__(in_RDI[10]._header);
  }
  if (in_RDI[0xb]._header != (Header *)0x0) {
    operator_delete__(in_RDI[0xb]._header);
  }
  this_01 = in_RDI[0xc]._header;
  if (this_01 != (Header *)0x0) {
    operator_delete__(this_01);
  }
  if (in_RDI[0xd]._header != (Header *)0x0) {
    operator_delete__(in_RDI[0xd]._header);
  }
  this_00 = in_RDI[0x11]._header;
  if (this_00 != (Header *)0x0) {
    Zip::~Zip((Zip *)this_00);
    operator_delete(this_00,0x18);
  }
  for (local_c = 0; local_c < 3; local_c = local_c + 1) {
    if ((&in_RDI[0xe]._header)[local_c] != (Header *)0x0) {
      operator_delete__((&in_RDI[0xe]._header)[local_c]);
    }
  }
  std::
  vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>::
  ~vector((vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
           *)this_01);
  std::
  vector<Imf_3_2::DwaCompressor::CscChannelSet,_std::allocator<Imf_3_2::DwaCompressor::CscChannelSet>_>
  ::~vector((vector<Imf_3_2::DwaCompressor::CscChannelSet,_std::allocator<Imf_3_2::DwaCompressor::CscChannelSet>_>
             *)this_01);
  std::
  vector<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
  ::~vector((vector<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
             *)this_01);
  ChannelList::~ChannelList((ChannelList *)0x1c9fce);
  Compressor::~Compressor(in_RDI);
  return;
}

Assistant:

DwaCompressor::~DwaCompressor ()
{
    delete[] _packedAcBuffer;
    delete[] _packedDcBuffer;
    delete[] _rleBuffer;
    delete[] _outBuffer;
    delete _zip;

    for (int i = 0; i < NUM_COMPRESSOR_SCHEMES; ++i)
        delete[] _planarUncBuffer[i];
}